

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readmod.c
# Opt level: O0

DUMB_IT_SIGDATA * it_mod_load_sigdata(DUMBFILE *f,int restrict_)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int32 iVar5;
  uint uVar6;
  int iVar7;
  int32 iVar8;
  int iVar9;
  IT_SAMPLE *pIVar10;
  uchar *puVar11;
  IT_PATTERN *pIVar12;
  DUMB_IT_SIGDATA *sigdata_00;
  uint in_ESI;
  DUMBFILE *in_RDI;
  int sep;
  uchar *buffer_1;
  uchar *order;
  long remain;
  long offset;
  long total_sample_size;
  long sample_number;
  uchar buffer [5];
  uint32 fft;
  int i;
  int n_channels;
  DUMB_IT_SIGDATA *sigdata;
  uint in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  IT_SAMPLE *in_stack_ffffffffffffff98;
  DUMBFILE *in_stack_ffffffffffffffa0;
  IT_SAMPLE *in_stack_ffffffffffffffa8;
  long local_48;
  uchar *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar13;
  DUMB_IT_SIGDATA *local_8;
  
  iVar3 = dumbfile_seek((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
  if (iVar3 != 0) {
    return (DUMB_IT_SIGDATA *)0x0;
  }
  uVar4 = dumbfile_mgetl((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar3 = dumbfile_error(in_RDI);
  if (iVar3 != 0) {
    return (DUMB_IT_SIGDATA *)0x0;
  }
  iVar3 = dumbfile_seek((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
  if (iVar3 != 0) {
    return (DUMB_IT_SIGDATA *)0x0;
  }
  local_8 = (DUMB_IT_SIGDATA *)malloc(0x138);
  if (local_8 == (DUMB_IT_SIGDATA *)0x0) {
    return (DUMB_IT_SIGDATA *)0x0;
  }
  iVar5 = dumbfile_getnc((char *)in_stack_ffffffffffffffa8,
                         (int32)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                         (DUMBFILE *)in_stack_ffffffffffffff98);
  if (iVar5 < 0x14) {
    free(local_8);
    return (DUMB_IT_SIGDATA *)0x0;
  }
  local_8->name[0x14] = '\0';
  local_8->n_samples = 0x1f;
  if (uVar4 == 0x3136434e) {
    iVar3 = 0x10;
    goto LAB_009a7889;
  }
  if (uVar4 == 0x3332434e) {
    iVar3 = 0x20;
    goto LAB_009a7889;
  }
  if (uVar4 != 0x38000000) {
    if (uVar4 == 0x43443831) {
LAB_009a76ee:
      iVar3 = 8;
      goto LAB_009a7889;
    }
    if (uVar4 != 0x464c5434) {
      if (uVar4 == 0x464c5438) {
        iVar3 = 0;
        goto LAB_009a7889;
      }
      if (((((uVar4 != 0x4d000000) && (uVar4 != 0x4d214b21)) && (uVar4 != 0x4d264b21)) &&
          ((uVar4 != 0x4d2e4b2e && (uVar4 != 0x4e2e542e)))) && (uVar4 != 0x4e534d53)) {
        if ((uVar4 != 0x4f435441) && (uVar4 != 0x4f4b5441)) {
          if ((uVar4 & 0xffff) == 0x4348) {
            if ((uVar4 < 0x31000000) || (0x33ffffff < uVar4)) {
              iVar3 = 4;
              local_8->n_samples = 0xf;
            }
            else {
              uVar6 = (uVar4 >> 0x10 & 0xff) - 0x30;
              if (uVar6 < 10) {
                iVar3 = uVar6 + ((uVar4 >> 0x18) - 0x30) * 10;
                if (0x3e < iVar3 - 1U) {
                  iVar3 = 4;
                  local_8->n_samples = 0xf;
                }
              }
              else {
                iVar3 = 4;
                local_8->n_samples = 0xf;
              }
            }
          }
          else if ((uVar4 & 0xffffff) == 0x43484e) {
            iVar3 = (uVar4 >> 0x18) - 0x30;
            if (8 < (uVar4 >> 0x18) - 0x31) {
              iVar3 = 4;
              local_8->n_samples = 0xf;
            }
          }
          else if ((uVar4 & 0xffffff00) == 0x54445a00) {
            iVar3 = (uVar4 & 0xff) - 0x30;
            if (8 < (uVar4 & 0xff) - 0x31) {
              iVar3 = 4;
              local_8->n_samples = 0xf;
            }
          }
          else {
            iVar3 = 4;
            local_8->n_samples = 0xf;
          }
          goto LAB_009a7889;
        }
        goto LAB_009a76ee;
      }
    }
  }
  iVar3 = 4;
LAB_009a7889:
  if (((in_ESI & 1) == 0) || (local_8->n_samples != 0xf)) {
    iVar9 = iVar3;
    if (iVar3 == 0) {
      iVar9 = 8;
    }
    local_8->n_pchannels = iVar9;
    uVar6 = uVar4;
    pIVar10 = (IT_SAMPLE *)malloc((long)local_8->n_samples * 0x68);
    local_8->sample = pIVar10;
    if (local_8->sample == (IT_SAMPLE *)0x0) {
      free(local_8);
      local_8 = (DUMB_IT_SIGDATA *)0x0;
    }
    else {
      local_8->song_message = (uchar *)0x0;
      local_8->order = (uchar *)0x0;
      local_8->instrument = (IT_INSTRUMENT *)0x0;
      local_8->pattern = (IT_PATTERN *)0x0;
      local_8->midi = (IT_MIDI *)0x0;
      local_8->checkpoint = (IT_CHECKPOINT *)0x0;
      local_8->n_instruments = 0;
      for (iVar13 = 0; iVar13 < local_8->n_samples; iVar13 = iVar13 + 1) {
        local_8->sample[iVar13].data = (void *)0x0;
      }
      for (iVar13 = 0; iVar13 < local_8->n_samples; iVar13 = iVar13 + 1) {
        iVar7 = it_mod_read_sample_header
                          (in_stack_ffffffffffffff98,
                           (DUMBFILE *)CONCAT44(in_stack_ffffffffffffff94,uVar4),iVar9);
        if (iVar7 != 0) {
          _dumb_it_unload_sigdata(in_stack_ffffffffffffffa0);
          return (DUMB_IT_SIGDATA *)0x0;
        }
      }
      iVar13 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar9,in_stack_ffffffffffffff88));
      local_8->n_orders = iVar13;
      iVar13 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar9,in_stack_ffffffffffffff88));
      local_8->restart_position = (uchar)iVar13;
      puVar11 = (uchar *)malloc(0x80);
      local_8->order = puVar11;
      if (local_8->order == (uchar *)0x0) {
        _dumb_it_unload_sigdata(in_stack_ffffffffffffffa0);
        local_8 = (DUMB_IT_SIGDATA *)0x0;
      }
      else {
        iVar5 = dumbfile_getnc((char *)in_stack_ffffffffffffffa8,
                               (int32)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                               (DUMBFILE *)in_stack_ffffffffffffff98);
        if (iVar5 < 0x80) {
          _dumb_it_unload_sigdata(in_stack_ffffffffffffffa0);
          local_8 = (DUMB_IT_SIGDATA *)0x0;
        }
        else {
          if ((local_8->n_orders < 1) || (0x80 < local_8->n_orders)) {
            local_8->n_orders = 0x80;
          }
          if (iVar3 == 0) {
            for (iVar13 = 0; iVar13 < 0x80; iVar13 = iVar13 + 1) {
              local_8->order[iVar13] = (uchar)((int)(uint)local_8->order[iVar13] >> 1);
            }
          }
          if (local_8->n_samples == 0x1f) {
            dumbfile_skip((DUMBFILE *)in_stack_ffffffffffffff98,
                          CONCAT44(in_stack_ffffffffffffff94,uVar4));
          }
          local_8->n_patterns = -1;
          if ((in_ESI & 2) == 0) {
            for (iVar9 = 0; iVar9 < 0x80; iVar9 = iVar9 + 1) {
              if (local_8->n_patterns < (int)(uint)local_8->order[iVar9]) {
                local_8->n_patterns = (uint)local_8->order[iVar9];
              }
            }
            local_8->n_patterns = local_8->n_patterns + 1;
          }
          else {
            iVar5 = dumbfile_pos(in_RDI);
            iVar8 = dumbfile_get_size((DUMBFILE *)0x9a7ba6);
            in_stack_ffffffffffffffa8 = (IT_SAMPLE *)((long)iVar8 - (long)iVar5);
            iVar13 = dumbfile_error(in_RDI);
            if ((iVar13 != 0) ||
               (iVar13 = dumbfile_seek((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff94,uVar4),
                                       CONCAT44(iVar9,in_stack_ffffffffffffff88),0), iVar13 != 0)) {
              _dumb_it_unload_sigdata(in_stack_ffffffffffffffa0);
              return (DUMB_IT_SIGDATA *)0x0;
            }
            in_stack_ffffffffffffffc0 = (uchar *)(long)(local_8->n_samples + -1);
            local_48 = 0;
            while( true ) {
              iVar8 = dumbfile_pos(in_RDI);
              uVar2 = in_stack_ffffffffffffff88 & 0xffffff;
              if ((long)iVar5 < (long)iVar8) {
                uVar2 = CONCAT13(-1 < (long)in_stack_ffffffffffffffc0,
                                 (int3)in_stack_ffffffffffffff88);
              }
              in_stack_ffffffffffffff88 = uVar2;
              if ((char)(in_stack_ffffffffffffff88 >> 0x18) == '\0') break;
              if ((local_8->sample[(long)in_stack_ffffffffffffffc0].flags & 1) != 0) {
                iVar13 = dumbfile_seek((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff94,uVar4),
                                       CONCAT44(iVar9,in_stack_ffffffffffffff88),0);
                if ((iVar13 != 0) ||
                   (iVar8 = dumbfile_getnc((char *)in_stack_ffffffffffffffa8,
                                           (int32)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                                           (DUMBFILE *)in_stack_ffffffffffffff98), iVar8 < 5)) {
                  _dumb_it_unload_sigdata(in_stack_ffffffffffffffa0);
                  return (DUMB_IT_SIGDATA *)0x0;
                }
                iVar13 = memcmp(&stack0xffffffffffffffcf,"ADPCM",5);
                if (iVar13 == 0) {
                  iVar13 = (local_8->sample[(long)in_stack_ffffffffffffffc0].length + 1) / 2 + 0x15;
                  iVar7 = dumbfile_seek((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff94,uVar4),
                                        CONCAT44(iVar9,in_stack_ffffffffffffff88),0);
                  if (iVar7 != 0) {
                    _dumb_it_unload_sigdata(in_stack_ffffffffffffffa0);
                    return (DUMB_IT_SIGDATA *)0x0;
                  }
                }
                else {
                  iVar13 = local_8->sample[(long)in_stack_ffffffffffffffc0].length;
                  iVar7 = dumbfile_seek((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff94,uVar4),
                                        CONCAT44(iVar9,in_stack_ffffffffffffff88),0);
                  if (iVar7 != 0) {
                    _dumb_it_unload_sigdata(in_stack_ffffffffffffffa0);
                    return (DUMB_IT_SIGDATA *)0x0;
                  }
                }
                local_48 = iVar13 + local_48;
              }
              in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + -1;
            }
            if ((local_48 < (long)in_stack_ffffffffffffffa8) &&
               ((local_8->n_patterns =
                      (int)((long)((long)in_stack_ffffffffffffffa8 + (4 - local_48)) /
                           (long)(local_8->n_pchannels << 8)), uVar6 == 0x4d000000 ||
                (uVar6 == 0x38000000)))) {
              in_stack_ffffffffffffffa8 =
                   (IT_SAMPLE *)
                   ((long)in_stack_ffffffffffffffa8 -
                   (long)(local_8->n_patterns * 0x100 * local_8->n_pchannels));
              iVar9 = dumbfile_skip((DUMBFILE *)in_stack_ffffffffffffff98,
                                    CONCAT44(in_stack_ffffffffffffff94,uVar4));
              if (iVar9 != 0) {
                _dumb_it_unload_sigdata(in_stack_ffffffffffffffa0);
                return (DUMB_IT_SIGDATA *)0x0;
              }
            }
          }
          if (local_8->n_patterns < 1) {
            _dumb_it_unload_sigdata(in_stack_ffffffffffffffa0);
            local_8 = (DUMB_IT_SIGDATA *)0x0;
          }
          else {
            if ((local_8->n_orders < 0x80) &&
               (in_stack_ffffffffffffffa0 =
                     (DUMBFILE *)realloc(local_8->order,(long)local_8->n_orders),
               in_stack_ffffffffffffffa0 != (DUMBFILE *)0x0)) {
              local_8->order = (uchar *)in_stack_ffffffffffffffa0;
            }
            pIVar12 = (IT_PATTERN *)malloc((long)local_8->n_patterns << 4);
            local_8->pattern = pIVar12;
            if (local_8->pattern == (IT_PATTERN *)0x0) {
              _dumb_it_unload_sigdata(in_stack_ffffffffffffffa0);
              local_8 = (DUMB_IT_SIGDATA *)0x0;
            }
            else {
              for (iVar9 = 0; iVar9 < local_8->n_patterns; iVar9 = iVar9 + 1) {
                local_8->pattern[iVar9].entry = (IT_ENTRY *)0x0;
              }
              sigdata_00 = (DUMB_IT_SIGDATA *)malloc((long)(local_8->n_pchannels << 8));
              if (sigdata_00 == (DUMB_IT_SIGDATA *)0x0) {
                _dumb_it_unload_sigdata(in_stack_ffffffffffffffa0);
                local_8 = (DUMB_IT_SIGDATA *)0x0;
              }
              else {
                for (iVar9 = 0; iVar9 < local_8->n_patterns; iVar9 = iVar9 + 1) {
                  iVar13 = it_mod_read_pattern((IT_PATTERN *)CONCAT44(iVar3,iVar9),
                                               (DUMBFILE *)CONCAT44(uVar6,in_stack_ffffffffffffffd0)
                                               ,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0)
                  ;
                  if (iVar13 != 0) {
                    free(sigdata_00);
                    _dumb_it_unload_sigdata(in_stack_ffffffffffffffa0);
                    return (DUMB_IT_SIGDATA *)0x0;
                  }
                }
                free(sigdata_00);
                for (iVar3 = 0; iVar3 < local_8->n_samples; iVar3 = iVar3 + 1) {
                  iVar9 = it_mod_read_sample_data
                                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                     (uint32)((ulong)sigdata_00 >> 0x20));
                  if (iVar9 != 0) {
                    _dumb_it_unload_sigdata(in_stack_ffffffffffffffa0);
                    return (DUMB_IT_SIGDATA *)0x0;
                  }
                }
                local_8->flags = 0xf1;
                local_8->global_volume = 0x80;
                local_8->mixing_volume = 0x30;
                local_8->speed = 6;
                local_8->tempo = 0x7d;
                local_8->pan_separation = 0x80;
                memset(local_8->channel_volume,0x40,0x40);
                for (iVar3 = 0; iVar3 < 0x40; iVar3 = iVar3 + 4) {
                  cVar1 = (char)((dumb_it_default_panning_separation << 5) / 100);
                  local_8->channel_pan[iVar3] = ' ' - cVar1;
                  local_8->channel_pan[iVar3 + 1] = cVar1 + ' ';
                  local_8->channel_pan[iVar3 + 2] = cVar1 + ' ';
                  local_8->channel_pan[iVar3 + 3] = ' ' - cVar1;
                }
                _dumb_it_fix_invalid_orders(sigdata_00);
              }
            }
          }
        }
      }
    }
  }
  else {
    free(local_8);
    local_8 = (DUMB_IT_SIGDATA *)0x0;
  }
  return local_8;
}

Assistant:

static DUMB_IT_SIGDATA *it_mod_load_sigdata(DUMBFILE *f, int restrict_)
{
	DUMB_IT_SIGDATA *sigdata;
	int n_channels;
	int i;
	uint32 fft;

    if ( dumbfile_seek(f, MOD_FFT_OFFSET, DFS_SEEK_SET) )
        return NULL;

    fft = dumbfile_mgetl(f);
    if (dumbfile_error(f))
        return NULL;

    if ( dumbfile_seek(f, 0, DFS_SEEK_SET) )
        return NULL;

	sigdata = malloc(sizeof(*sigdata));
	if (!sigdata) {
		return NULL;
	}

	/**
      1       20   Chars     Title of the song.  If the title is not a
                             full 20 chars in length, it will be null-
                             terminated.
	*/
    if (dumbfile_getnc((char *)sigdata->name, 20, f) < 20) {
		free(sigdata);
        return NULL;
	}
	sigdata->name[20] = 0;

	sigdata->n_samples = 31;

	switch (fft) {
		case DUMB_ID('M','.','K','.'):
		case DUMB_ID('M','!','K','!'):
		case DUMB_ID('M','&','K','!'):
		case DUMB_ID('N','.','T','.'):
		case DUMB_ID('N','S','M','S'):
		case DUMB_ID('F','L','T','4'):
		case DUMB_ID('M',0,0,0):
		case DUMB_ID('8',0,0,0):
			n_channels = 4;
			break;
		case DUMB_ID('F','L','T','8'):
			n_channels = 0;
			/* 0 indicates a special case; two four-channel patterns must be
			 * combined into one eight-channel pattern. Pattern indexes must
			 * be halved. Why oh why do they obfuscate so?
			 */
			/*for (i = 0; i < 128; i++)
				sigdata->order[i] >>= 1;*/
			break;
		case DUMB_ID('C','D','8','1'):
		case DUMB_ID('O','C','T','A'):
		case DUMB_ID('O','K','T','A'):
			n_channels = 8;
			break;
		case DUMB_ID('1','6','C','N'):
			n_channels = 16;
			break;
		case DUMB_ID('3','2','C','N'):
			n_channels = 32;
			break;
		default:
			/* If we get an illegal tag, assume 4 channels 15 samples. */
			if ((fft & 0x0000FFFFL) == DUMB_ID(0,0,'C','H')) {
				if (fft >= '1' << 24 && fft < '4' << 24) {
					n_channels = ((fft & 0x00FF0000L) >> 16) - '0';
					if ((unsigned int)n_channels >= 10) {
						/* Rightmost character wasn't a digit. */
						n_channels = 4;
						sigdata->n_samples = 15;
					} else {
						n_channels += (((fft & 0xFF000000L) >> 24) - '0') * 10;
						/* MODs should really only go up to 32 channels, but we're lenient. */
						if ((unsigned int)(n_channels - 1) >= DUMB_IT_N_CHANNELS - 1) {
							/* No channels or too many? Can't be right... */
							n_channels = 4;
							sigdata->n_samples = 15;
						}
					}
				} else {
					n_channels = 4;
					sigdata->n_samples = 15;
				}
			} else if ((fft & 0x00FFFFFFL) == DUMB_ID(0,'C','H','N')) {
				n_channels = (fft >> 24) - '0';
				if ((unsigned int)(n_channels - 1) >= 9) {
					/* Character was '0' or it wasn't a digit */
					n_channels = 4;
					sigdata->n_samples = 15;
				}
			} else if ((fft & 0xFFFFFF00L) == DUMB_ID('T','D','Z',0)) {
				n_channels = (fft & 0x000000FFL) - '0';
				if ((unsigned int)(n_channels - 1) >= 9) {
					/* We've been very lenient, given that it should have
					 * been 1, 2 or 3, but this MOD has been very naughty and
					 * must be punished.
					 */
					n_channels = 4;
					sigdata->n_samples = 15;
				}
			} else {
				n_channels = 4;
				sigdata->n_samples = 15;
			}
	}

	// moo
	if ( ( restrict_ & 1 ) && sigdata->n_samples == 15 )
	{
		free(sigdata);
        return NULL;
	}

	sigdata->n_pchannels = n_channels ? n_channels : 8; /* special case for 0, see above */

	sigdata->sample = malloc(sigdata->n_samples * sizeof(*sigdata->sample));
	if (!sigdata->sample) {
		free(sigdata);
        return NULL;
	}

	sigdata->song_message = NULL;
	sigdata->order = NULL;
	sigdata->instrument = NULL;
	sigdata->pattern = NULL;
	sigdata->midi = NULL;
	sigdata->checkpoint = NULL;

	sigdata->n_instruments = 0;

	for (i = 0; i < sigdata->n_samples; i++)
		sigdata->sample[i].data = NULL;

	for (i = 0; i < sigdata->n_samples; i++) {
		if (it_mod_read_sample_header(&sigdata->sample[i], f, sigdata->n_samples == 15)) {
			_dumb_it_unload_sigdata(sigdata);
            return NULL;
		}
	}

	sigdata->n_orders = dumbfile_getc(f);
	sigdata->restart_position = dumbfile_getc(f);
	// what if this is >= 127? what about with Fast Tracker II?

/*	if (sigdata->n_orders <= 0 || sigdata->n_orders > 128) { // is this right?
		_dumb_it_unload_sigdata(sigdata);
        return NULL;
	}*/

	//if (sigdata->restart_position >= sigdata->n_orders)
		//sigdata->restart_position = 0;

	sigdata->order = malloc(128); /* We may need to scan the extra ones! */
	if (!sigdata->order) {
		_dumb_it_unload_sigdata(sigdata);
        return NULL;
	}
    if (dumbfile_getnc((char *)sigdata->order, 128, f) < 128) {
		_dumb_it_unload_sigdata(sigdata);
        return NULL;
	}

	if (sigdata->n_orders <= 0 || sigdata->n_orders > 128) { // is this right?
		sigdata->n_orders = 128;
		//while (sigdata->n_orders > 1 && !sigdata->order[sigdata->n_orders - 1]) sigdata->n_orders--;
	}

	if ( ! n_channels )
		for (i = 0; i < 128; i++)
			sigdata->order[i] >>= 1;

	/* "The old NST format contains only 15 samples (instead of 31). Further
	 * it doesn't contain a file format tag (id). So Pattern data offset is
	 * at 20+15*30+1+1+128."
	 * - Then I shall assume the File Format Tag never exists if there are
	 * only 15 samples. I hope this isn't a faulty assumption...
	 */
	if (sigdata->n_samples == 31)
		dumbfile_skip(f, 4);

	sigdata->n_patterns = -1;

    if ( ( restrict_ & 2 ) )
	{
        unsigned char buffer[5];
        long sample_number;
        long total_sample_size;
        long offset = dumbfile_pos(f);
        long remain = dumbfile_get_size(f) - offset;
        if ( dumbfile_error( f ) ||
             dumbfile_seek( f, 0, SEEK_END ) ) {
            _dumb_it_unload_sigdata(sigdata);
            return NULL;
        }
        sample_number = sigdata->n_samples - 1;
        total_sample_size = 0;
        while (dumbfile_pos(f) > offset && sample_number >= 0) {
            if (sigdata->sample[sample_number].flags & IT_SAMPLE_EXISTS) {
                if ( dumbfile_seek(f, -((sigdata->sample[sample_number].length + 1) / 2 + 5 + 16), DFS_SEEK_CUR) ||
                     dumbfile_getnc((char *)buffer, 5, f) < 5 ) {
                    _dumb_it_unload_sigdata(sigdata);
                    return NULL;
                }
                if ( !memcmp( buffer, "ADPCM", 5 ) ) { /* BAH */
                    total_sample_size += (sigdata->sample[sample_number].length + 1) / 2 + 5 + 16;
                    if ( dumbfile_seek(f, -5, DFS_SEEK_CUR) ) {
                        _dumb_it_unload_sigdata(sigdata);
                        return NULL;
                    }
                } else {
                    total_sample_size += sigdata->sample[sample_number].length;
                    if ( dumbfile_seek(f, -(sigdata->sample[sample_number].length - ((sigdata->sample[sample_number].length + 1) / 2 + 5 + 16) + 5), DFS_SEEK_CUR) ) {
                        _dumb_it_unload_sigdata(sigdata);
                        return NULL;
                    }
                }
            }
            --sample_number;
        }

		if (remain > total_sample_size) {
			sigdata->n_patterns = ( remain - total_sample_size + 4 ) / ( 256 * sigdata->n_pchannels );
			if (fft == DUMB_ID('M',0,0,0) || fft == DUMB_ID('8',0,0,0)) {
				remain -= sigdata->n_patterns * 256 * sigdata->n_pchannels;
				if (dumbfile_skip(f, remain - total_sample_size)) {
					_dumb_it_unload_sigdata(sigdata);
					return NULL;
				}
			}
		}
	}
	else
    {
        for (i = 0; i < 128; i++)
        {
            if (sigdata->order[i] > sigdata->n_patterns)
                sigdata->n_patterns = sigdata->order[i];
        }
		sigdata->n_patterns++;
	}

	if ( sigdata->n_patterns <= 0 ) {
		_dumb_it_unload_sigdata(sigdata);
		return NULL;
	}

	/* May as well try to save a tiny bit of memory. */
	if (sigdata->n_orders < 128) {
		unsigned char *order = realloc(sigdata->order, sigdata->n_orders);
		if (order) sigdata->order = order;
	}

	sigdata->pattern = malloc(sigdata->n_patterns * sizeof(*sigdata->pattern));
	if (!sigdata->pattern) {
		_dumb_it_unload_sigdata(sigdata);
		return NULL;
	}
	for (i = 0; i < sigdata->n_patterns; i++)
		sigdata->pattern[i].entry = NULL;

	/* Read in the patterns */
	{
		unsigned char *buffer = malloc(256 * sigdata->n_pchannels); /* 64 rows * 4 bytes */
		if (!buffer) {
			_dumb_it_unload_sigdata(sigdata);
			return NULL;
		}
		for (i = 0; i < sigdata->n_patterns; i++) {
			if (it_mod_read_pattern(&sigdata->pattern[i], f, n_channels, buffer) != 0) {
				free(buffer);
				_dumb_it_unload_sigdata(sigdata);
				return NULL;
			}
		}
		free(buffer);
	}

	/* And finally, the sample data */
	for (i = 0; i < sigdata->n_samples; i++) {
		if (it_mod_read_sample_data(&sigdata->sample[i], f, fft)) {
			_dumb_it_unload_sigdata(sigdata);
			return NULL;
		}
	}

	/* w00t! */
	/*if ( n_channels == 4 &&
		( sigdata->n_samples == 15 ||
		( ( fft & 240 ) != DUMB_ID( 0, 0, 'C', 0 ) &&
		( fft & 240 ) != DUMB_ID( 0, 0, 'H', 0 ) &&
		( fft & 240 ) != 0 ) ) ) {
		for ( i = 0; i < sigdata->n_samples; ++i ) {
			IT_SAMPLE * sample = &sigdata->sample [i];
			if ( sample && ( sample->flags & IT_SAMPLE_EXISTS ) ) {
				int n, o;
				o = sample->length;
				if ( o > 4 ) o = 4;
				for ( n = 0; n < o; ++n )
					( ( char * ) sample->data ) [n] = 0;
			}
		}
	}*/

	/* Now let's initialise the remaining variables, and we're done! */
	sigdata->flags = IT_WAS_AN_XM | IT_WAS_A_MOD | IT_OLD_EFFECTS | IT_COMPATIBLE_GXX | IT_STEREO;

	sigdata->global_volume = 128;
	sigdata->mixing_volume = 48;
	/* We want 50 ticks per second; 50/6 row advances per second;
	 * 50*10=500 row advances per minute; 500/4=125 beats per minute.
	 */
	sigdata->speed = 6;
	sigdata->tempo = 125;
	sigdata->pan_separation = 128;

	memset(sigdata->channel_volume, 64, DUMB_IT_N_CHANNELS);

	for (i = 0; i < DUMB_IT_N_CHANNELS; i += 4) {
		int sep = 32 * dumb_it_default_panning_separation / 100;
		sigdata->channel_pan[i+0] = 32 - sep;
		sigdata->channel_pan[i+1] = 32 + sep;
		sigdata->channel_pan[i+2] = 32 + sep;
		sigdata->channel_pan[i+3] = 32 - sep;
	}

	_dumb_it_fix_invalid_orders(sigdata);

	return sigdata;
}